

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O3

char * Abc_FrameGiaOutputMiniLutAttr(Abc_Frame_t *pAbc,void *pMiniLut)

{
  Gia_Man_t *pGia;
  char *pcVar1;
  
  if (pAbc == (Abc_Frame_t *)0x0) {
    puts("ABC framework is not initialized by calling Abc_Start()");
  }
  pGia = Abc_FrameReadGia(pAbc);
  if (pGia == (Gia_Man_t *)0x0) {
    puts("Current network in ABC framework is not defined.");
    pGia = (Gia_Man_t *)0x0;
  }
  pcVar1 = Gia_ManToMiniLutAttr(pGia,pMiniLut);
  return pcVar1;
}

Assistant:

char * Abc_FrameGiaOutputMiniLutAttr( Abc_Frame_t * pAbc, void * pMiniLut )
{
    Gia_Man_t * pGia;
    if ( pAbc == NULL )
        printf( "ABC framework is not initialized by calling Abc_Start()\n" );
    pGia = Abc_FrameReadGia( pAbc );
    if ( pGia == NULL )
        printf( "Current network in ABC framework is not defined.\n" );
    return Gia_ManToMiniLutAttr( pGia, pMiniLut );
}